

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O3

void call_laspack_method(IterProcType method,Sparse_matrix *lh_side,double *unknown_vector,
                        double *rh_side,double max_iterations,PrecondProcType preconditioner,
                        double relaxation_constant)

{
  Vector unknown_vector_laspack;
  Vector rh_side_laspack;
  QMatrix lh_side_laspack;
  Vector local_140;
  Vector local_110;
  QMatrix local_e0;
  
  Q_Constr(&local_e0,"Matrix",(ulong)lh_side->size,False,Rowws,Normal,True);
  V_Constr(&local_110,"Right-hand side of equation",(ulong)lh_side->size,Normal,False);
  V_Constr(&local_140,"Unknown vector",(ulong)lh_side->size,Normal,False);
  Sparse_matrix_to_QMatrix(lh_side,&local_e0);
  local_110.Cmp = rh_side + -1;
  local_140.Cmp = unknown_vector + -1;
  (*method)(&local_e0,&local_140,&local_110,(int)max_iterations,preconditioner,relaxation_constant);
  Q_Destr(&local_e0);
  V_Destr(&local_110);
  V_Destr(&local_140);
  return;
}

Assistant:

void call_laspack_method (
    IterProcType    method,
    Sparse_matrix * lh_side,
    double        * unknown_vector,
    double        * rh_side,
    double          max_iterations,
    PrecondProcType preconditioner,
    double          relaxation_constant) {

  QMatrix lh_side_laspack;
  Vector rh_side_laspack;
  Vector unknown_vector_laspack;

  Q_Constr (&lh_side_laspack,
            "Matrix",
            lh_side->size, /* side */
            False, /* non-symmetric */
            Rowws, /* row-wise storage */
            Normal,
            True);
  V_Constr (&rh_side_laspack,
            "Right-hand side of equation",
            lh_side->size,
            Normal,
            False); /* we pass our own data */
  V_Constr (&unknown_vector_laspack,
            "Unknown vector",
            lh_side->size,
            Normal,
            False); /* the same here */

  Sparse_matrix_to_QMatrix (lh_side, &lh_side_laspack);

  /* Laspack Vector indices start with 1 */
  rh_side_laspack.Cmp = rh_side - 1;
  unknown_vector_laspack.Cmp = unknown_vector - 1;

  (*method) (&lh_side_laspack,
             &unknown_vector_laspack,
             &rh_side_laspack,
             max_iterations,
             preconditioner,
             relaxation_constant);

  Q_Destr (&lh_side_laspack);
  V_Destr (&rh_side_laspack);
  V_Destr (&unknown_vector_laspack);

}